

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O2

void __thiscall miniminer_tests::miniminer_negative::miniminer_negative(miniminer_negative *this)

{
  long lVar1;
  TestOpts opts;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  opts.coins_db_in_memory = true;
  opts.block_tree_db_in_memory = true;
  opts.setup_net = true;
  opts.setup_validation_interface = true;
  opts._28_4_ = in_stack_ffffffffffffffe4 & 0xffffff00;
  TestChain100Setup::TestChain100Setup(&this->super_TestChain100Setup,REGTEST,opts);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(miniminer_negative, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    // Create a transaction that will be prioritised to have a negative modified fee.
    const CAmount positive_base_fee{1000};
    const CAmount negative_fee_delta{-50000};
    const CAmount negative_modified_fees{positive_base_fee + negative_fee_delta};
    BOOST_CHECK(negative_modified_fees < 0);
    const auto tx_mod_negative = make_tx({COutPoint{m_coinbase_txns[4]->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(positive_base_fee).FromTx(tx_mod_negative));
    pool.PrioritiseTransaction(tx_mod_negative->GetHash(), negative_fee_delta);
    const COutPoint only_outpoint{tx_mod_negative->GetHash(), 0};

    // When target feerate is 0, transactions with negative fees are not selected.
    node::MiniMiner mini_miner_target0(pool, {only_outpoint});
    BOOST_CHECK(mini_miner_target0.IsReadyToCalculate());
    const CFeeRate feerate_zero(0);
    mini_miner_target0.BuildMockTemplate(feerate_zero);
    // Check the quit condition:
    BOOST_CHECK(negative_modified_fees < feerate_zero.GetFee(Assert(pool.GetEntry(tx_mod_negative->GetHash()))->GetTxSize()));
    BOOST_CHECK(mini_miner_target0.GetMockTemplateTxids().empty());

    // With no target feerate, the template includes all transactions, even negative feerate ones.
    node::MiniMiner mini_miner_no_target(pool, {only_outpoint});
    BOOST_CHECK(mini_miner_no_target.IsReadyToCalculate());
    mini_miner_no_target.BuildMockTemplate(std::nullopt);
    const auto template_txids{mini_miner_no_target.GetMockTemplateTxids()};
    BOOST_CHECK_EQUAL(template_txids.size(), 1);
    BOOST_CHECK(template_txids.count(tx_mod_negative->GetHash().ToUint256()) > 0);
}